

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O0

int thresholded_search(int32 *diff_window,fixed32 threshold,int start,int end)

{
  int iVar1;
  int local_28;
  int diff;
  int argmin;
  int min;
  int i;
  int end_local;
  int start_local;
  fixed32 threshold_local;
  int32 *diff_window_local;
  
  diff = 0x7fffffff;
  local_28 = 0;
  argmin = start;
  while( true ) {
    if (end <= argmin) {
      return local_28;
    }
    iVar1 = diff_window[argmin];
    if (iVar1 < threshold) break;
    if (iVar1 < diff) {
      local_28 = argmin;
      diff = iVar1;
    }
    argmin = argmin + 1;
  }
  return argmin;
}

Assistant:

int
thresholded_search(int32 *diff_window, fixed32 threshold, int start, int end)
{
    int i, min, argmin;

    min = INT_MAX;
    argmin = 0;
    for (i = start; i < end; ++i) {
        int diff = diff_window[i];

        if (diff < threshold) {
            min = diff;
            argmin = i;
            break;
        }
        if (diff < min) {
            min = diff;
            argmin = i;
        }
    }
    return argmin;
}